

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

void __thiscall Json::Value::setComment(Value *this,char *comment,CommentPlacement placement)

{
  undefined8 *puVar1;
  CommentInfo *this_00;
  long lVar2;
  CommentInfo *pCVar3;
  
  pCVar3 = this->comments_;
  if (pCVar3 == (CommentInfo *)0x0) {
    puVar1 = (undefined8 *)operator_new__(0x20);
    *puVar1 = 3;
    pCVar3 = (CommentInfo *)(puVar1 + 1);
    lVar2 = 0;
    this_00 = pCVar3;
    do {
      CommentInfo::CommentInfo(this_00);
      lVar2 = lVar2 + -8;
      this_00 = this_00 + 1;
    } while (lVar2 != -0x18);
    this->comments_ = pCVar3;
  }
  CommentInfo::setComment(pCVar3 + placement,comment);
  return;
}

Assistant:

void 
Value::setComment( const char *comment,
                   CommentPlacement placement )
{
   if ( !comments_ )
      comments_ = new CommentInfo[numberOfCommentPlacement];
   comments_[placement].setComment( comment );
}